

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.h
# Opt level: O2

int sat_solver_add_and(sat_solver *pSat,int iVar,int iVar0,int iVar1,int fCompl0,int fCompl1,
                      int fCompl)

{
  int iVar2;
  int iVar3;
  lit Lits [3];
  int local_3c;
  uint local_38;
  uint local_34;
  
  iVar3 = iVar * 2 + 1;
  local_38 = (uint)(fCompl0 != 0) + iVar0 * 2;
  local_3c = iVar3;
  iVar2 = sat_solver_addclause(pSat,&local_3c,(lit *)&local_34);
  if (iVar2 == 0) {
    __assert_fail("Cid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                  ,0x196,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
  }
  local_38 = (uint)(fCompl1 != 0) + iVar1 * 2;
  local_3c = iVar3;
  iVar3 = sat_solver_addclause(pSat,&local_3c,(lit *)&local_34);
  if (iVar3 != 0) {
    local_3c = iVar * 2;
    local_38 = (uint)(fCompl0 == 0) | iVar0 * 2;
    local_34 = (uint)(fCompl1 == 0) | iVar1 * 2;
    iVar3 = sat_solver_addclause(pSat,&local_3c,(lit *)&stack0xffffffffffffffd0);
    if (iVar3 != 0) {
      return iVar3;
    }
    __assert_fail("Cid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                  ,0x1a1,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
  }
  __assert_fail("Cid",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                ,0x19b,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
}

Assistant:

static inline int sat_solver_add_and( sat_solver * pSat, int iVar, int iVar0, int iVar1, int fCompl0, int fCompl1, int fCompl )
{
    lit Lits[3];
    int Cid;

    Lits[0] = toLitCond( iVar, !fCompl );
    Lits[1] = toLitCond( iVar0, fCompl0 );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 2 );
    assert( Cid );

    Lits[0] = toLitCond( iVar, !fCompl );
    Lits[1] = toLitCond( iVar1, fCompl1 );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 2 );
    assert( Cid );

    Lits[0] = toLitCond( iVar, fCompl );
    Lits[1] = toLitCond( iVar0, !fCompl0 );
    Lits[2] = toLitCond( iVar1, !fCompl1 );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 3 );
    assert( Cid );
    return 3;
}